

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reaction.cpp
# Opt level: O2

Ptr __thiscall Bind::ChoosePolymer(Bind *this)

{
  pointer psVar1;
  element_type *peVar2;
  int iVar3;
  SpeciesTracker *this_00;
  VecPtr *pVVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Polymer> *polymer_1;
  pointer psVar5;
  long in_RSI;
  string *promoter_name;
  Ptr PVar6;
  Ptr *polymer;
  _Vector_base<double,_std::allocator<double>_> local_58;
  element_type *local_40;
  double local_38;
  
  local_40 = (element_type *)this;
  this_00 = SpeciesTracker::Instance();
  promoter_name = (string *)(in_RSI + 0x38);
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pVVar4 = SpeciesTracker::FindPolymers(this_00,promoter_name);
  psVar1 = (pVVar4->
           super__Vector_base<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>)
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar5 = (pVVar4->
                super__Vector_base<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>
                )._M_impl.super__Vector_impl_data._M_start; psVar5 != psVar1; psVar5 = psVar5 + 1) {
    iVar3 = Polymer::uncovered((psVar5->super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr,promoter_name);
    local_38 = (double)iVar3;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              ((vector<double,_std::allocator<double>_> *)&local_58,&local_38);
  }
  pVVar4 = SpeciesTracker::FindPolymers(this_00,promoter_name);
  peVar2 = local_40;
  Random::WeightedChoice<std::shared_ptr<Polymer>>
            ((Random *)local_40,pVVar4,(vector<double,_std::allocator<double>_> *)&local_58);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_58);
  PVar6.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar6.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  return (Ptr)PVar6.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Polymer::Ptr Bind::ChoosePolymer() {
  auto &tracker = SpeciesTracker::Instance();
  auto weights = std::vector<double>();
  for (const auto &polymer : tracker.FindPolymers(promoter_name_)) {
    weights.push_back(double(polymer->uncovered(promoter_name_)));
  }
  Polymer::Ptr polymer =
      Random::WeightedChoice(tracker.FindPolymers(promoter_name_), weights);
  return polymer;
}